

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O0

Node * __thiscall Node::OutputBstringText_abi_cxx11_(Node *this)

{
  int *in_RSI;
  undefined1 local_b0 [48];
  undefined1 local_80 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [39];
  undefined1 local_19;
  Node *this_local;
  string *result;
  
  local_19 = 0;
  this_local = this;
  std::__cxx11::string::string((string *)this);
  if (*in_RSI == 0x1d4) {
    Expression_abi_cxx11_((Node *)local_80);
    std::operator+(local_80 + 0x20,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "std::string(");
    std::operator+(local_40,local_80 + 0x20);
    std::__cxx11::string::operator=((string *)this,(string *)local_40);
    std::__cxx11::string::~string((string *)local_40);
    std::__cxx11::string::~string((string *)(local_80 + 0x20));
    std::__cxx11::string::~string((string *)local_80);
  }
  else {
    Expression_abi_cxx11_((Node *)local_b0);
    std::__cxx11::string::operator=((string *)this,(string *)local_b0);
    std::__cxx11::string::~string((string *)local_b0);
  }
  return this;
}

Assistant:

std::string Node::OutputBstringText(void)
{
	std::string result;

	switch(Type)
	{
	case BAS_V_TEXTSTRING:
		result = "std::string(" + Expression() + ")";
		break;

	default:
		result = Expression();
		break;
	}

	return result;
}